

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O2

void cuddReclaim(DdManager *table,DdNode *n)

{
  DdHalfWord *pDVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  DdNode **ppDVar5;
  uint uVar6;
  DdNode *pDVar7;
  anon_union_16_2_50f58667_for_type *paVar8;
  int iVar9;
  
  ppDVar5 = table->stack;
  uVar3 = table->dead;
  iVar9 = 1;
  pDVar7 = (DdNode *)((ulong)n & 0xfffffffffffffffe);
  uVar6 = uVar3;
  do {
    if (pDVar7->ref == 0) {
      pDVar7->ref = 1;
      uVar6 = uVar6 - 1;
      table->dead = uVar6;
      if ((ulong)pDVar7->index == 0x7fffffff) {
        puVar2 = &(table->constants).dead;
        *puVar2 = *puVar2 - 1;
        goto LAB_00661795;
      }
      iVar4 = table->perm[pDVar7->index];
      paVar8 = &pDVar7->type;
      ppDVar5[iVar9] = (DdNode *)((ulong)(pDVar7->type).kids.E & 0xfffffffffffffffe);
      puVar2 = &table->subtables[iVar4].dead;
      *puVar2 = *puVar2 - 1;
      iVar9 = iVar9 + 1;
    }
    else {
      pDVar7->ref = pDVar7->ref + 1;
LAB_00661795:
      paVar8 = (anon_union_16_2_50f58667_for_type *)(ppDVar5 + (long)iVar9 + -1);
      iVar9 = iVar9 + -1;
    }
    pDVar7 = (paVar8->kids).T;
    if (iVar9 == 0) {
      pDVar1 = &((DdNode *)((ulong)n & 0xfffffffffffffffe))->ref;
      *pDVar1 = *pDVar1 - 1;
      table->reclaimed = ((double)uVar3 - (double)uVar6) + table->reclaimed;
      return;
    }
  } while( true );
}

Assistant:

void
cuddReclaim(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;
    double initialDead = table->dead;

    N = Cudd_Regular(n);

#ifdef DD_DEBUG
    assert(N->ref == 0);
#endif

    do {
        if (N->ref == 0) {
            N->ref = 1;
            table->dead--;
            if (cuddIsConstant(N)) {
                table->constants.dead--;
                N = stack[--SP];
            } else {
                ord = table->perm[N->index];
                stack[SP++] = Cudd_Regular(cuddE(N));
                table->subtables[ord].dead--;
                N = cuddT(N);
            }
        } else {
            cuddSatInc(N->ref);
            N = stack[--SP];
        }
    } while (SP != 0);

    N = Cudd_Regular(n);
    cuddSatDec(N->ref);
    table->reclaimed += initialDead - table->dead;

}